

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

ImageChannelValues * __thiscall
pbrt::Image::L1Error
          (ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,Image *ref,
          Image *errorImage)

{
  size_t sVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar2;
  float value;
  Image *pIVar3;
  ImageChannelDesc *pIVar4;
  int iVar5;
  Allocator alloc;
  ulong uVar6;
  ulong uVar7;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar10;
  long lVar11;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first;
  size_t sVar13;
  Point2i PVar14;
  Tuple2<pbrt::Point2,_int> TVar15;
  ulong uVar16;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  allocator_type local_201;
  Image *local_200;
  long local_1f8;
  ImageChannelDesc *local_1f0;
  Point2i vb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  Image *local_1b8;
  vector<double,_std::allocator<double>_> sumError;
  ImageChannelDesc refDesc;
  ColorEncodingHandle local_150;
  Point2i va;
  int local_140;
  undefined4 uStack_13c;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  ColorEncodingHandle local_98;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_90;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_70;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_50;
  
  va.super_Tuple2<pbrt::Point2,_int>.x = 0;
  va.super_Tuple2<pbrt::Point2,_int>.y = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&sumError,(desc->offset).nStored,(value_type_conflict4 *)&va,(allocator_type *)&refDesc
            );
  local_1f0 = desc;
  ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&va,this,desc);
  requestedChannels.n =
       CONCAT44(uStack_13c,local_140) - (long)va.super_Tuple2<pbrt::Point2,_int> >> 5;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       va.super_Tuple2<pbrt::Point2,_int>;
  GetChannelDesc(&refDesc,ref,requestedChannels);
  local_200 = errorImage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&va);
  if (refDesc.offset.nStored == 0) {
    LogFatal<char_const(&)[14]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x224,"Check failed: %s",(char (*) [14])"(bool)refDesc");
  }
  TVar15 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  vb.super_Tuple2<pbrt::Point2,_int> = (ref->resolution).super_Tuple2<pbrt::Point2,_int>;
  va.super_Tuple2<pbrt::Point2,_int> = TVar15;
  if ((TVar15.x == vb.super_Tuple2<pbrt::Point2,_int>.x) &&
     (iVar5 = TVar15.y, iVar5 == vb.super_Tuple2<pbrt::Point2,_int>.y)) {
    local_1b8 = this;
    if (local_200 != (Image *)0x0) {
      pbVar9 = (this->channelNames).ptr;
      __first = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(this->channelNames).field_2;
      if (pbVar9 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        __first = pbVar9;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<std::__cxx11::string_const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vb,__first,
                 __first + (this->channelNames).nStored,&local_201);
      PVar14.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int>;
      local_150.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      lVar11 = (long)local_1e0 - (long)vb.super_Tuple2<pbrt::Point2,_int>;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar11 >> 5;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     PVar14.super_Tuple2<pbrt::Point2,_int>;
      Image((Image *)&va,Float,(Point2i)TVar15,channels,&local_150,alloc);
      pIVar3 = local_200;
      (local_200->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_140;
      local_200->format = va.super_Tuple2<pbrt::Point2,_int>.x;
      (local_200->resolution).super_Tuple2<pbrt::Point2,_int>.x =
           va.super_Tuple2<pbrt::Point2,_int>.y;
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_200->channelNames,&local_138);
      (pIVar3->encoding).
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (uintptr_t)
              local_98.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&pIVar3->p8,&local_90);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                (&pIVar3->p16,&local_70);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&pIVar3->p32,&local_50);
      local_50.nStored = 0;
      (*(local_50.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_50.alloc.memoryResource,local_50.ptr,local_50.nAlloc << 2,4);
      local_70.nStored = 0;
      (*(local_70.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_70.alloc.memoryResource,local_70.ptr,local_70.nAlloc * 2,2);
      this = local_1b8;
      local_90.nStored = 0;
      (*(local_90.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_90.alloc.memoryResource,local_90.ptr,local_90.nAlloc,1);
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vb);
      TVar15 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      iVar5 = TVar15.y;
    }
    if (0 < iVar5) {
      local_1f8 = 0;
      do {
        if (0 < TVar15.x) {
          uVar16 = 0;
          uVar6 = local_1f8 << 0x20;
          do {
            pIVar4 = local_1f0;
            PVar14.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar6 | uVar16);
            GetChannels((ImageChannelValues *)&va,this,PVar14,local_1f0,(WrapMode2D)0x200000002);
            GetChannels((ImageChannelValues *)&vb,ref,PVar14,&refDesc,(WrapMode2D)0x200000002);
            uVar7 = (pIVar4->offset).nStored;
            if (uVar7 != 0) {
              uVar12 = 0;
              do {
                pIVar8 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(uStack_13c,local_140);
                if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(uStack_13c,local_140) ==
                    (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
                  pIVar8 = &local_138;
                }
                pbVar9 = local_1e0;
                if (local_1e0 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pbVar9 = &local_1d8;
                }
                value = *(float *)((long)&(pIVar8->alloc).memoryResource + uVar12 * 4) -
                        *(float *)((long)&(pbVar9->_M_dataplus)._M_p + uVar12 * 4);
                if (ABS(value) != INFINITY) {
                  sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12] =
                       (double)value +
                       sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12];
                  if (local_200 != (Image *)0x0) {
                    SetChannel(local_200,PVar14,(int)uVar12,value);
                    uVar7 = (local_1f0->offset).nStored;
                  }
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 < uVar7);
            }
            local_1d8.field_2._8_8_ = 0;
            (**(code **)(*(long *)vb.super_Tuple2<pbrt::Point2,_int> + 0x18))
                      (vb.super_Tuple2<pbrt::Point2,_int>,local_1e0,
                       local_1d8.field_2._M_allocated_capacity << 2,4);
            local_138.field_2.fixed[0]._M_string_length = 0;
            (**(code **)(*(long *)va.super_Tuple2<pbrt::Point2,_int> + 0x18))
                      (va.super_Tuple2<pbrt::Point2,_int>,CONCAT44(uStack_13c,local_140),
                       (long)local_138.field_2.fixed[0]._M_dataplus._M_p << 2,4);
            uVar16 = uVar16 + 1;
            TVar15 = (local_1b8->resolution).super_Tuple2<pbrt::Point2,_int>;
            this = local_1b8;
          } while ((long)uVar16 < (long)TVar15.x);
        }
        local_1f8 = local_1f8 + 1;
      } while (local_1f8 < (long)TVar15 >> 0x20);
    }
    pIVar4 = local_1f0;
    sVar1 = (local_1f0->offset).nStored;
    vb.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int> & 0xffffffff00000000;
    va.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pstd::pmr::new_delete_resource()
    ;
    InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
              (&__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,sVar1,
               (float *)&vb,(polymorphic_allocator<float> *)&va);
    sVar1 = (pIVar4->offset).nStored;
    if (sVar1 != 0) {
      paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      paVar10 = &(__return_storage_ptr__->
                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      if (paVar2 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar10 = paVar2;
      }
      sVar13 = 0;
      do {
        TVar15 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
        paVar10->fixed[sVar13] =
             (float)(sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar13] / (double)(TVar15.y * TVar15.x));
        sVar13 = sVar13 + 1;
      } while (sVar1 != sVar13);
    }
    refDesc.offset.nStored = 0;
    (*(refDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (refDesc.offset.alloc.memoryResource,refDesc.offset.ptr,refDesc.offset.nAlloc << 2,4);
    if (sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)sumError.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x225,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])0x4b9f22,
             (char (*) [17])"ref.Resolution()",(char (*) [13])0x4b9f22,(Point2<int> *)&va,
             (char (*) [17])"ref.Resolution()",&vb);
}

Assistant:

ImageChannelValues Image::L1Error(const ImageChannelDesc &desc, const Image &ref,
                                  Image *errorImage) const {
    std::vector<double> sumError(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    CHECK((bool)refDesc);
    CHECK_EQ(Resolution(), ref.Resolution());

    if (errorImage)
        *errorImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float error = v[c] - vref[c];
                if (std::isinf(error))
                    continue;
                sumError[c] += error;
                if (errorImage)
                    errorImage->SetChannel({x, y}, c, error);
            }
        }

    ImageChannelValues error(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        error[c] = sumError[c] / (Resolution().x * Resolution().y);
    return error;
}